

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void __thiscall bssl::SSL3_STATE::SSL3_STATE(SSL3_STATE *this)

{
  *(undefined8 *)((long)&(this->write_buffer).buf_ + 6) = 0;
  (this->write_buffer).buf_ = (uint8_t *)0x0;
  this->read_shutdown = ssl_shutdown_none;
  this->write_shutdown = ssl_shutdown_none;
  this->ech_status = ssl_ech_none;
  this->read_sequence = 0;
  this->write_sequence = 0;
  this->server_random[0] = '\0';
  this->server_random[1] = '\0';
  this->server_random[2] = '\0';
  this->server_random[3] = '\0';
  this->server_random[4] = '\0';
  this->server_random[5] = '\0';
  this->server_random[6] = '\0';
  this->server_random[7] = '\0';
  this->server_random[8] = '\0';
  this->server_random[9] = '\0';
  this->server_random[10] = '\0';
  this->server_random[0xb] = '\0';
  this->server_random[0xc] = '\0';
  this->server_random[0xd] = '\0';
  this->server_random[0xe] = '\0';
  this->server_random[0xf] = '\0';
  this->server_random[0x10] = '\0';
  this->server_random[0x11] = '\0';
  this->server_random[0x12] = '\0';
  this->server_random[0x13] = '\0';
  this->server_random[0x14] = '\0';
  this->server_random[0x15] = '\0';
  this->server_random[0x16] = '\0';
  this->server_random[0x17] = '\0';
  this->server_random[0x18] = '\0';
  this->server_random[0x19] = '\0';
  this->server_random[0x1a] = '\0';
  this->server_random[0x1b] = '\0';
  this->server_random[0x1c] = '\0';
  this->server_random[0x1d] = '\0';
  this->server_random[0x1e] = '\0';
  this->server_random[0x1f] = '\0';
  this->client_random[0] = '\0';
  this->client_random[1] = '\0';
  this->client_random[2] = '\0';
  this->client_random[3] = '\0';
  this->client_random[4] = '\0';
  this->client_random[5] = '\0';
  this->client_random[6] = '\0';
  this->client_random[7] = '\0';
  this->client_random[8] = '\0';
  this->client_random[9] = '\0';
  this->client_random[10] = '\0';
  this->client_random[0xb] = '\0';
  this->client_random[0xc] = '\0';
  this->client_random[0xd] = '\0';
  this->client_random[0xe] = '\0';
  this->client_random[0xf] = '\0';
  this->client_random[0x10] = '\0';
  this->client_random[0x11] = '\0';
  this->client_random[0x12] = '\0';
  this->client_random[0x13] = '\0';
  this->client_random[0x14] = '\0';
  this->client_random[0x15] = '\0';
  this->client_random[0x16] = '\0';
  this->client_random[0x17] = '\0';
  this->client_random[0x18] = '\0';
  this->client_random[0x19] = '\0';
  this->client_random[0x1a] = '\0';
  this->client_random[0x1b] = '\0';
  this->client_random[0x1c] = '\0';
  this->client_random[0x1d] = '\0';
  this->client_random[0x1e] = '\0';
  this->client_random[0x1f] = '\0';
  *(undefined8 *)(this->client_random + 0x1e) = 0;
  *(undefined8 *)((long)&(this->read_buffer).buf_ + 6) = 0;
  (this->pending_app_data).data_ = (uchar *)0x0;
  (this->pending_app_data).size_ = 0;
  this->unreported_bytes_written = 0;
  (this->pending_write).data_ = (uchar *)0x0;
  *(undefined8 *)((long)&(this->pending_write).data_ + 1) = 0;
  *(undefined8 *)((long)&(this->pending_write).size_ + 1) = 0;
  (this->read_error)._M_t.super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl = (err_save_state_st *)0x0;
  this->total_renegotiations = 0;
  this->rwstate = 0;
  *(undefined8 *)((long)&this->rwstate + 3) = 0;
  *(undefined8 *)((long)&this->quic_write_level + 3) = 0;
  *(ushort *)&this->field_0xdc = *(ushort *)&this->field_0xdc & 0xc000;
  (this->write_traffic_secret).size_ = '\0';
  (this->read_traffic_secret).size_ = '\0';
  (this->exporter_secret).size_ = '\0';
  (this->previous_client_finished).size_ = '\0';
  *(undefined2 *)&(this->previous_server_finished).size_ = 0;
  this->send_alert[1] = '\0';
  (this->pending_flight)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (buf_mem_st *)0x0;
  this->pending_flight_offset = 0;
  this->ticket_age_skew = 0;
  this->early_data_reason = ssl_early_data_unknown;
  (this->hs_buf)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (buf_mem_st *)0x0;
  (this->pending_hs_data)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (buf_mem_st *)0x0;
  (this->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl = (SSL_HANDSHAKE *)0x0;
  (this->aead_read_ctx)._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
  _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = (SSLAEADContext *)0x0;
  (this->aead_write_ctx)._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
  _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = (SSLAEADContext *)0x0;
  memset(&this->established_session,0,0x88);
  return;
}

Assistant:

SSLBuffer() {}